

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O0

int run_test_process_ref(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_200 [4];
  int r;
  uv_process_t h;
  char exepath [256];
  size_t local_70;
  size_t exepath_size;
  uv_process_options_t options;
  char *argv [3];
  
  options.uid = 0;
  options.gid = 0;
  memset(&exepath_size,0,0x40);
  local_70 = 0x100;
  iVar1 = uv_exepath((char *)&h.status,&local_70);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
            ,0x19d,"r == 0");
    abort();
  }
  options._56_8_ = &h.status;
  options.exit_cb = (uv_exit_cb)&h.status;
  options.file = (char *)&options.uid;
  exepath_size = 0;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,(uv_process_t *)local_200,(uv_process_options_t *)&exepath_size);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
            ,0x1a5,"r == 0");
    abort();
  }
  uv_unref((uv_handle_t *)local_200);
  puVar2 = uv_default_loop();
  uv_run(puVar2,UV_RUN_DEFAULT);
  iVar1 = uv_process_kill((uv_process_t *)local_200,0xf);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
            ,0x1ab,"r == 0");
    abort();
  }
  do_close(local_200);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
            ,0x1af,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(process_ref) {
  /* spawn_helper4 blocks indefinitely. */
  char *argv[] = { NULL, "spawn_helper4", NULL };
  uv_process_options_t options;
  size_t exepath_size;
  char exepath[256];
  uv_process_t h;
  int r;

  memset(&options, 0, sizeof(options));
  exepath_size = sizeof(exepath);

  r = uv_exepath(exepath, &exepath_size);
  ASSERT(r == 0);

  argv[0] = exepath;
  options.file = exepath;
  options.args = argv;
  options.exit_cb = NULL;

  r = uv_spawn(uv_default_loop(), &h, &options);
  ASSERT(r == 0);

  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  r = uv_process_kill(&h, /* SIGTERM */ 15);
  ASSERT(r == 0);

  do_close(&h);

  MAKE_VALGRIND_HAPPY();
  return 0;
}